

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tableview.cpp
# Opt level: O0

void __thiscall
QtMWidgets::TableView::insertSection(TableView *this,int index,TableViewSection *section)

{
  QVBoxLayout *pQVar1;
  TableViewPrivate *pTVar2;
  uint uVar3;
  long lVar4;
  qsizetype qVar5;
  QObject *pQVar6;
  QFlags<Qt::AlignmentFlag> local_2c;
  TableViewPrivate *local_28;
  TableViewPrivate *d;
  TableViewSection *section_local;
  TableView *pTStack_10;
  int index_local;
  TableView *this_local;
  
  d = (TableViewPrivate *)section;
  section_local._4_4_ = index;
  pTStack_10 = this;
  local_28 = d_func(this);
  if ((d != (TableViewPrivate *)0x0) && (-1 < (int)section_local._4_4_)) {
    lVar4 = (long)(int)section_local._4_4_;
    qVar5 = QList<QtMWidgets::TableViewSection_*>::size(&local_28->sections);
    if (qVar5 < lVar4) {
      qVar5 = QList<QtMWidgets::TableViewSection_*>::size(&local_28->sections);
      section_local._4_4_ = (uint)qVar5;
    }
    pQVar6 = QObject::parent((QObject *)d);
    if (pQVar6 != (QObject *)local_28->widget) {
      QWidget::setParent((QWidget *)d);
    }
    uVar3 = section_local._4_4_;
    pTVar2 = d;
    pQVar1 = local_28->layout;
    QFlags<Qt::AlignmentFlag>::QFlags(&local_2c);
    QBoxLayout::insertWidget
              ((int)pQVar1,(QWidget *)(ulong)uVar3,(int)pTVar2,(QFlags_conflict1 *)0x0);
    QList<QtMWidgets::TableViewSection_*>::insert
              (&local_28->sections,(long)(int)section_local._4_4_,(parameter_type)d);
    TableViewSection::setHighlightCellOnClick
              ((TableViewSection *)d,(bool)(local_28->highlightCellOnClick & 1));
    QWidget::show();
  }
  return;
}

Assistant:

void
TableView::insertSection( int index, TableViewSection * section )
{
	TableViewPrivate * d = d_func();

	if( !section || index < 0 )
		return;

	if( index > d->sections.size() )
		index = d->sections.size();

	if( section->parent() != d->widget )
		section->setParent( d->widget );
	d->layout->insertWidget( index, section );
	d->sections.insert( index, section );
	section->setHighlightCellOnClick( d->highlightCellOnClick );
	section->show();
}